

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::suf::Kind>,testing::Matcher<int>>,std::tuple<fmt::BasicStringRef<char>,mp::suf::Kind,int>>
               (tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
                *matchers,tuple<fmt::BasicStringRef<char>,_mp::suf::Kind,_int> *values,ostream *os)

{
  Kind KVar1;
  MatcherInterface<mp::suf::Kind> *pMVar2;
  char cVar3;
  ostream *poVar4;
  BiggestInt kBigInt;
  type matcher;
  string local_1d0;
  StringMatchResultListener listener;
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::suf::Kind>,testing::Matcher<int>>,std::tuple<fmt::BasicStringRef<char>,mp::suf::Kind,int>>
            (matchers,values,os);
  Matcher<mp::suf::Kind>::Matcher
            (&matcher,&(matchers->
                       super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
                       ).
                       super__Tuple_impl<1UL,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
                       .super__Head_base<1UL,_testing::Matcher<mp::suf::Kind>,_false>._M_head_impl);
  KVar1 = (values->super__Tuple_impl<0UL,_fmt::BasicStringRef<char>,_mp::suf::Kind,_int>).
          super__Tuple_impl<1UL,_mp::suf::Kind,_int>.super__Head_base<1UL,_mp::suf::Kind,_false>.
          _M_head_impl;
  StringMatchResultListener::StringMatchResultListener(&listener);
  cVar3 = (**(code **)(*(long *)matcher.super_MatcherBase<mp::suf::Kind>.impl_.value_ + 0x20))
                    (matcher.super_MatcherBase<mp::suf::Kind>.impl_.value_,KVar1,&listener);
  if (cVar3 == '\0') {
    poVar4 = std::operator<<(os,"  Expected arg #");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,": ");
    pMVar2 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
             ).super__Tuple_impl<1UL,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>.
             super__Head_base<1UL,_testing::Matcher<mp::suf::Kind>,_false>._M_head_impl.
             super_MatcherBase<mp::suf::Kind>.impl_.value_;
    (**(code **)(*(long *)pMVar2 + 0x10))(pMVar2,os);
    std::operator<<(os,"\n           Actual: ");
    std::ostream::_M_insert<long_long>((longlong)os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&listener);
  MatcherBase<mp::suf::Kind>::~MatcherBase(&matcher.super_MatcherBase<mp::suf::Kind>);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }